

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O0

int stbtt_InitFont_internal(stbtt_fontinfo *info,uchar *data,int fontstart)

{
  stbtt_uint16 sVar1;
  stbtt_uint32 sVar2;
  stbtt_uint32 sVar3;
  undefined4 in_EDX;
  long in_RSI;
  long in_RDI;
  stbtt__buf sVar4;
  stbtt_uint32 encoding_record;
  stbtt_uint32 cff;
  stbtt_uint32 fdselectoff;
  stbtt_uint32 fdarrayoff;
  stbtt_uint32 charstrings;
  stbtt_uint32 cstype;
  stbtt__buf topdictidx;
  stbtt__buf topdict;
  stbtt__buf b;
  stbtt_int32 numTables;
  stbtt_int32 i;
  stbtt_uint32 t;
  stbtt_uint32 cmap;
  undefined4 in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe6c;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  undefined4 in_stack_fffffffffffffe80;
  stbtt_uint32 in_stack_fffffffffffffe84;
  uint uVar5;
  stbtt__buf in_stack_fffffffffffffe88;
  stbtt__buf in_stack_fffffffffffffe98;
  stbtt__buf in_stack_fffffffffffffea8;
  uchar *local_128;
  undefined8 local_120;
  uchar *local_118;
  undefined8 local_110;
  uchar *local_b8;
  undefined8 local_b0;
  uchar *local_a8;
  undefined8 local_a0;
  uchar *local_98;
  undefined8 local_90;
  stbtt__buf local_50;
  stbtt__buf local_40;
  uint local_2c;
  int local_28;
  stbtt_uint32 local_24;
  stbtt_uint32 local_20;
  long local_18;
  long local_10;
  int local_4;
  
  *(long *)(in_RDI + 8) = in_RSI;
  *(undefined4 *)(in_RDI + 0x10) = in_EDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_40 = stbtt__new_buf((void *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                            CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  *(uchar **)(local_10 + 0x40) = local_40.data;
  *(undefined8 *)(local_10 + 0x48) = local_40._8_8_;
  local_20 = stbtt__find_table(in_stack_fffffffffffffe88.data,in_stack_fffffffffffffe84,
                               (char *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78)
                              );
  sVar2 = stbtt__find_table(in_stack_fffffffffffffe88.data,in_stack_fffffffffffffe84,
                            (char *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  *(stbtt_uint32 *)(local_10 + 0x18) = sVar2;
  sVar2 = stbtt__find_table(in_stack_fffffffffffffe88.data,in_stack_fffffffffffffe84,
                            (char *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  *(stbtt_uint32 *)(local_10 + 0x1c) = sVar2;
  sVar2 = stbtt__find_table(in_stack_fffffffffffffe88.data,in_stack_fffffffffffffe84,
                            (char *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  *(stbtt_uint32 *)(local_10 + 0x20) = sVar2;
  sVar2 = stbtt__find_table(in_stack_fffffffffffffe88.data,in_stack_fffffffffffffe84,
                            (char *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  *(stbtt_uint32 *)(local_10 + 0x24) = sVar2;
  sVar2 = stbtt__find_table(in_stack_fffffffffffffe88.data,in_stack_fffffffffffffe84,
                            (char *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  *(stbtt_uint32 *)(local_10 + 0x28) = sVar2;
  sVar2 = stbtt__find_table(in_stack_fffffffffffffe88.data,in_stack_fffffffffffffe84,
                            (char *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  *(stbtt_uint32 *)(local_10 + 0x2c) = sVar2;
  sVar2 = stbtt__find_table(in_stack_fffffffffffffe88.data,in_stack_fffffffffffffe84,
                            (char *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  *(stbtt_uint32 *)(local_10 + 0x30) = sVar2;
  if ((((local_20 == 0) || (*(int *)(local_10 + 0x1c) == 0)) || (*(int *)(local_10 + 0x24) == 0)) ||
     (*(int *)(local_10 + 0x28) == 0)) {
    local_4 = 0;
  }
  else if (*(int *)(local_10 + 0x20) == 0) {
    sVar2 = stbtt__find_table(in_stack_fffffffffffffe88.data,in_stack_fffffffffffffe84,
                              (char *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78))
    ;
    if (sVar2 == 0) {
      local_4 = 0;
    }
    else {
      sVar4 = stbtt__new_buf((void *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                             CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      local_98 = sVar4.data;
      *(uchar **)(local_10 + 0x80) = local_98;
      local_90 = sVar4._8_8_;
      *(undefined8 *)(local_10 + 0x88) = local_90;
      sVar4 = stbtt__new_buf((void *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                             CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      local_a8 = sVar4.data;
      *(uchar **)(local_10 + 0x90) = local_a8;
      local_a0 = sVar4._8_8_;
      *(undefined8 *)(local_10 + 0x98) = local_a0;
      sVar4 = stbtt__new_buf((void *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                             CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      local_b8 = sVar4.data;
      *(uchar **)(local_10 + 0x40) = local_b8;
      local_b0 = sVar4._8_8_;
      *(undefined8 *)(local_10 + 0x48) = local_b0;
      local_50.data = *(uchar **)(local_10 + 0x40);
      local_50._8_8_ = *(undefined8 *)(local_10 + 0x48);
      stbtt__buf_skip((stbtt__buf *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                      in_stack_fffffffffffffe6c);
      stbtt__buf_get8(&local_50);
      stbtt__buf_seek((stbtt__buf *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                      in_stack_fffffffffffffe6c);
      stbtt__cff_get_index
                ((stbtt__buf *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
      stbtt__cff_get_index
                ((stbtt__buf *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
      stbtt__cff_index_get(in_stack_fffffffffffffe88,in_stack_fffffffffffffe84);
      stbtt__cff_get_index
                ((stbtt__buf *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
      sVar4 = stbtt__cff_get_index
                        ((stbtt__buf *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80)
                        );
      local_118 = sVar4.data;
      *(uchar **)(local_10 + 0x60) = local_118;
      local_110 = sVar4._8_8_;
      *(undefined8 *)(local_10 + 0x68) = local_110;
      stbtt__dict_get_ints
                (in_stack_fffffffffffffe88._8_8_,in_stack_fffffffffffffe88.data._4_4_,
                 (int)in_stack_fffffffffffffe88.data,
                 (stbtt_uint32 *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
      stbtt__dict_get_ints
                (in_stack_fffffffffffffe88._8_8_,in_stack_fffffffffffffe88.data._4_4_,
                 (int)in_stack_fffffffffffffe88.data,
                 (stbtt_uint32 *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
      stbtt__dict_get_ints
                (in_stack_fffffffffffffe88._8_8_,in_stack_fffffffffffffe88.data._4_4_,
                 (int)in_stack_fffffffffffffe88.data,
                 (stbtt_uint32 *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
      stbtt__dict_get_ints
                (in_stack_fffffffffffffe88._8_8_,in_stack_fffffffffffffe88.data._4_4_,
                 (int)in_stack_fffffffffffffe88.data,
                 (stbtt_uint32 *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
      sVar4 = stbtt__get_subrs(in_stack_fffffffffffffea8,in_stack_fffffffffffffe98);
      local_128 = sVar4.data;
      *(uchar **)(local_10 + 0x70) = local_128;
      local_120 = sVar4._8_8_;
      *(undefined8 *)(local_10 + 0x78) = local_120;
      local_4 = 0;
    }
  }
  else if (*(int *)(local_10 + 0x18) == 0) {
    local_4 = 0;
  }
  else {
    local_24 = stbtt__find_table(in_stack_fffffffffffffe88.data,in_stack_fffffffffffffe84,
                                 (char *)CONCAT44(in_stack_fffffffffffffe7c,
                                                  in_stack_fffffffffffffe78));
    if (local_24 == 0) {
      *(undefined4 *)(local_10 + 0x14) = 0xffff;
    }
    else {
      sVar1 = ttUSHORT((stbtt_uint8 *)(local_18 + (ulong)local_24 + 4));
      *(uint *)(local_10 + 0x14) = (uint)sVar1;
    }
    sVar1 = ttUSHORT((stbtt_uint8 *)(local_18 + (ulong)local_20 + 2));
    local_2c = (uint)sVar1;
    *(undefined4 *)(local_10 + 0x34) = 0;
    for (local_28 = 0; local_28 < (int)local_2c; local_28 = local_28 + 1) {
      uVar5 = local_20 + 4 + local_28 * 8;
      sVar1 = ttUSHORT((stbtt_uint8 *)(local_18 + (ulong)uVar5));
      if (sVar1 == 0) {
        sVar2 = local_20;
        sVar3 = ttULONG((stbtt_uint8 *)(local_18 + (ulong)uVar5 + 4));
        *(stbtt_uint32 *)(local_10 + 0x34) = sVar2 + sVar3;
      }
      else if ((sVar1 == 3) &&
              ((sVar1 = ttUSHORT((stbtt_uint8 *)(local_18 + 2 + (ulong)uVar5)), sVar1 == 1 ||
               (sVar1 == 10)))) {
        sVar2 = local_20;
        sVar3 = ttULONG((stbtt_uint8 *)(local_18 + (ulong)uVar5 + 4));
        *(stbtt_uint32 *)(local_10 + 0x34) = sVar2 + sVar3;
      }
    }
    if (*(int *)(local_10 + 0x34) == 0) {
      local_4 = 0;
    }
    else {
      sVar1 = ttUSHORT((stbtt_uint8 *)(local_18 + *(int *)(local_10 + 0x1c) + 0x32));
      *(uint *)(local_10 + 0x38) = (uint)sVar1;
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static int stbtt_InitFont_internal(stbtt_fontinfo *info, unsigned char *data, int fontstart)
{
   stbtt_uint32 cmap, t;
   stbtt_int32 i,numTables;

   info->data = data;
   info->fontstart = fontstart;
   info->cff = stbtt__new_buf(NULL, 0);

   cmap = stbtt__find_table(data, fontstart, "cmap");       // required
   info->loca = stbtt__find_table(data, fontstart, "loca"); // required
   info->head = stbtt__find_table(data, fontstart, "head"); // required
   info->glyf = stbtt__find_table(data, fontstart, "glyf"); // required
   info->hhea = stbtt__find_table(data, fontstart, "hhea"); // required
   info->hmtx = stbtt__find_table(data, fontstart, "hmtx"); // required
   info->kern = stbtt__find_table(data, fontstart, "kern"); // not required
   info->gpos = stbtt__find_table(data, fontstart, "GPOS"); // not required

   if (!cmap || !info->head || !info->hhea || !info->hmtx)
      return 0;
   if (info->glyf) {
      // required for truetype
      if (!info->loca) return 0;
   } else {
      // initialization for CFF / Type2 fonts (OTF)
      stbtt__buf b, topdict, topdictidx;
      stbtt_uint32 cstype = 2, charstrings = 0, fdarrayoff = 0, fdselectoff = 0;
      stbtt_uint32 cff;

      cff = stbtt__find_table(data, fontstart, "CFF ");
      if (!cff) return 0;

      info->fontdicts = stbtt__new_buf(NULL, 0);
      info->fdselect = stbtt__new_buf(NULL, 0);

      // @TODO this should use size from table (not 512MB)
      info->cff = stbtt__new_buf(data+cff, 512*1024*1024);
      b = info->cff;

      // read the header
      stbtt__buf_skip(&b, 2);
      stbtt__buf_seek(&b, stbtt__buf_get8(&b)); // hdrsize

      // @TODO the name INDEX could list multiple fonts,
      // but we just use the first one.
      stbtt__cff_get_index(&b);  // name INDEX
      topdictidx = stbtt__cff_get_index(&b);
      topdict = stbtt__cff_index_get(topdictidx, 0);
      stbtt__cff_get_index(&b);  // string INDEX
      info->gsubrs = stbtt__cff_get_index(&b);

      stbtt__dict_get_ints(&topdict, 17, 1, &charstrings);
      stbtt__dict_get_ints(&topdict, 0x100 | 6, 1, &cstype);
      stbtt__dict_get_ints(&topdict, 0x100 | 36, 1, &fdarrayoff);
      stbtt__dict_get_ints(&topdict, 0x100 | 37, 1, &fdselectoff);
      info->subrs = stbtt__get_subrs(b, topdict);

      // we only support Type 2 charstrings
      if (cstype != 2) return 0;
      if (charstrings == 0) return 0;

      if (fdarrayoff) {
         // looks like a CID font
         if (!fdselectoff) return 0;
         stbtt__buf_seek(&b, fdarrayoff);
         info->fontdicts = stbtt__cff_get_index(&b);
         info->fdselect = stbtt__buf_range(&b, fdselectoff, b.size-fdselectoff);
      }

      stbtt__buf_seek(&b, charstrings);
      info->charstrings = stbtt__cff_get_index(&b);
   }

   t = stbtt__find_table(data, fontstart, "maxp");
   if (t)
      info->numGlyphs = ttUSHORT(data+t+4);
   else
      info->numGlyphs = 0xffff;

   // find a cmap encoding table we understand *now* to avoid searching
   // later. (todo: could make this installable)
   // the same regardless of glyph.
   numTables = ttUSHORT(data + cmap + 2);
   info->index_map = 0;
   for (i=0; i < numTables; ++i) {
      stbtt_uint32 encoding_record = cmap + 4 + 8 * i;
      // find an encoding we understand:
      switch(ttUSHORT(data+encoding_record)) {
         case STBTT_PLATFORM_ID_MICROSOFT:
            switch (ttUSHORT(data+encoding_record+2)) {
               case STBTT_MS_EID_UNICODE_BMP:
               case STBTT_MS_EID_UNICODE_FULL:
                  // MS/Unicode
                  info->index_map = cmap + ttULONG(data+encoding_record+4);
                  break;
            }
            break;
        case STBTT_PLATFORM_ID_UNICODE:
            // Mac/iOS has these
            // all the encodingIDs are unicode, so we don't bother to check it
            info->index_map = cmap + ttULONG(data+encoding_record+4);
            break;
      }
   }
   if (info->index_map == 0)
      return 0;

   info->indexToLocFormat = ttUSHORT(data+info->head + 50);
   return 1;
}